

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2sSpecialFloatTests.cpp
# Opt level: O3

void __thiscall deqp::gles2::Stress::anon_unknown_0::OutputCase::testFBO(OutputCase *this)

{
  RenderContext *context;
  TestLog *this_00;
  short sVar1;
  int iVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  deUint32 dVar5;
  ChannelOrder CVar6;
  int iVar7;
  void *__s;
  void *__s_00;
  undefined8 *puVar8;
  short *psVar9;
  undefined4 extraout_var;
  long lVar10;
  ConstPixelBufferAccess *pCVar11;
  Surface *surface;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  int z;
  int iVar12;
  qpTestResult testResult;
  char *pcVar13;
  TextureLevel *this_01;
  TestContext *this_02;
  int y;
  long lVar14;
  ostringstream *poVar15;
  void *pvVar16;
  float fVar17;
  Surface errorMask;
  TextureLevel specialImage;
  TextureFormat textureFormat;
  TextureLevel normalImage;
  Vec4 cNormal;
  Vec4 cSpecial;
  deUint32 uniformValue;
  string local_4d0;
  string local_4b0;
  string local_490;
  Surface local_470;
  TextureLevel local_458;
  TextureFormat local_430;
  string local_428;
  string local_408;
  string local_3e8;
  string local_3c8;
  string local_3a8;
  TextureLevel local_388;
  LogImageSet local_360;
  undefined1 local_320 [8];
  float local_318;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_310;
  _Alloc_hider local_300;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2f0 [6];
  undefined1 local_290 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_280;
  _Alloc_hider local_270;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_260 [6];
  undefined1 local_200 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f0;
  _Alloc_hider local_1e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d0 [4];
  ios_base local_188 [264];
  ConstPixelBufferAccess local_80;
  ConstPixelBufferAccess local_58;
  
  __s = operator_new(0x2e0);
  memset(__s,0,0x2e0);
  __s_00 = operator_new(0x108);
  memset(__s_00,0,0x108);
  local_430.type =
       (uint)(*(int *)&(this->super_FramebufferRenderCase).super_RenderCase.field_0x84 == 5) << 5 |
       UNORM_INT8;
  local_430.order = RGBA;
  tcu::TextureLevel::TextureLevel(&local_458,&local_430,0x100,0x100,1);
  tcu::TextureLevel::TextureLevel(&local_388,&local_430,0x100,0x100,1);
  puVar8 = (undefined8 *)((long)__s + 0x18);
  lVar10 = 0;
  do {
    fVar17 = (float)(int)lVar10 / 22.0;
    fVar17 = fVar17 + fVar17 + -1.0;
    *(undefined4 *)(puVar8 + -3) = 0xbf800000;
    *(float *)((long)puVar8 + -0x14) = fVar17;
    puVar8[-2] = 0x3f80000000000000;
    *(undefined4 *)(puVar8 + -1) = 0x3f800000;
    *(float *)((long)puVar8 + -4) = fVar17;
    *puVar8 = 0x3f80000000000000;
    lVar10 = lVar10 + 1;
    puVar8 = puVar8 + 4;
  } while (lVar10 != 0x17);
  psVar9 = (short *)((long)__s_00 + 10);
  lVar10 = -0x2c;
  do {
    sVar1 = (short)lVar10;
    psVar9[-5] = sVar1 + 0x2c;
    psVar9[-4] = sVar1 + 0x2e;
    psVar9[-3] = sVar1 + 0x2f;
    psVar9[-2] = sVar1 + 0x2c;
    psVar9[-1] = sVar1 + 0x2f;
    *psVar9 = sVar1 + 0x2d;
    psVar9 = psVar9 + 6;
    lVar10 = lVar10 + 2;
  } while (lVar10 != 0);
  iVar2 = (*((this->super_FramebufferRenderCase).super_RenderCase.super_TestCase.m_context)->
            m_renderCtx->_vptr_RenderContext[3])();
  lVar10 = CONCAT44(extraout_var,iVar2);
  uVar3 = (**(code **)(lVar10 + 0x780))
                    ((((this->super_FramebufferRenderCase).super_RenderCase.m_program)->m_program).
                     m_program,"a_pos");
  uVar4 = (**(code **)(lVar10 + 0xb48))
                    ((((this->super_FramebufferRenderCase).super_RenderCase.m_program)->m_program).
                     m_program,"u_special");
  (**(code **)(lVar10 + 0x1c0))(0,0,0,0x3f800000);
  (**(code **)(lVar10 + 0x1a00))(0,0,0x100,0x100);
  (**(code **)(lVar10 + 0x1680))
            ((((this->super_FramebufferRenderCase).super_RenderCase.m_program)->m_program).m_program
            );
  dVar5 = (**(code **)(lVar10 + 0x800))();
  glu::checkError(dVar5,"pre-draw",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/stress/es2sSpecialFloatTests.cpp"
                  ,0x54c);
  (**(code **)(lVar10 + 0x19f0))(uVar3,4,0x1406,0,0,__s);
  (**(code **)(lVar10 + 0x610))(uVar3);
  iVar2 = 0;
  do {
    poVar15 = (ostringstream *)(local_200 + 8);
    local_200._0_8_ =
         ((this->super_FramebufferRenderCase).super_RenderCase.super_TestCase.super_TestCase.
          super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream(poVar15);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar15,"Pass ",5);
    std::ostream::operator<<(poVar15,iVar2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar15,
               ": Drawing stripes with the shader. Setting u_special for each stripe to (",0x49);
    pcVar13 = "1.0";
    if (iVar2 == 0) {
      pcVar13 = "special";
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar15,pcVar13,(ulong)(iVar2 == 0) * 4 + 3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar15,").",2);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_200,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar15);
    std::ios_base::~ios_base(local_188);
    (**(code **)(lVar10 + 0x188))(0x4000);
    lVar14 = 0;
    pvVar16 = __s_00;
    do {
      CVar6 = 0x3f800000;
      if (iVar2 == 0) {
        CVar6 = *(ChannelOrder *)((long)&Stress::(anonymous_namespace)::s_specialFloats + lVar14);
      }
      local_200._0_4_ = CVar6;
      (**(code **)(lVar10 + 0x14e8))(uVar4,1,(MessageBuilder *)local_200);
      (**(code **)(lVar10 + 0x568))(4,6,0x1403,pvVar16);
      pvVar16 = (void *)((long)pvVar16 + 0xc);
      lVar14 = lVar14 + 4;
    } while (lVar14 != 0x58);
    (**(code **)(lVar10 + 0x648))();
    context = ((this->super_FramebufferRenderCase).super_RenderCase.super_TestCase.m_context)->
              m_renderCtx;
    this_01 = &local_388;
    if (iVar2 == 0) {
      this_01 = &local_458;
    }
    tcu::TextureLevel::getAccess((PixelBufferAccess *)local_200,this_01);
    glu::readPixels(context,0,0,(PixelBufferAccess *)local_200);
    iVar2 = iVar2 + 1;
  } while (iVar2 != 2);
  (**(code **)(lVar10 + 0x518))(uVar3);
  (**(code **)(lVar10 + 0x1680))(0);
  dVar5 = (**(code **)(lVar10 + 0x800))();
  glu::checkError(dVar5,"OutputCase::iterate",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/stress/es2sSpecialFloatTests.cpp"
                  ,0x56b);
  tcu::Surface::Surface(&local_470,0x100,0x100);
  local_200._0_8_ =
       ((this->super_FramebufferRenderCase).super_RenderCase.super_TestCase.super_TestCase.
        super_TestNode.m_testCtx)->m_log;
  poVar15 = (ostringstream *)(local_200 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar15);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar15,
             "Checking passes have identical red and blue channels and the green channel is correct in the constant pass."
             ,0x6b);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_200,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar15);
  std::ios_base::~ios_base(local_188);
  if (local_458.m_size.m_data[1] < 1) {
    iVar2 = 0;
  }
  else {
    z = 0;
    iVar2 = 0;
    iVar12 = local_458.m_size.m_data[1];
    iVar7 = local_458.m_size.m_data[0];
    do {
      if (0 < iVar7) {
        y = 0;
        do {
          tcu::TextureLevel::getAccess((PixelBufferAccess *)local_200,&local_388);
          iVar12 = (int)(PixelBufferAccess *)local_200;
          tcu::ConstPixelBufferAccess::getPixel((ConstPixelBufferAccess *)local_320,iVar12,y,z);
          tcu::TextureLevel::getAccess((PixelBufferAccess *)local_200,&local_458);
          tcu::ConstPixelBufferAccess::getPixel((ConstPixelBufferAccess *)local_290,iVar12,y,z);
          if (((((float)local_320._0_4_ != (float)local_290._0_4_) ||
               (NAN((float)local_320._0_4_) || NAN((float)local_290._0_4_))) ||
              (local_318 != (float)local_290._8_4_)) ||
             ((NAN(local_318) || NAN((float)local_290._8_4_) ||
              (uVar3 = 0xff00ff00, (float)local_320._4_4_ < 0.9)))) {
            iVar2 = iVar2 + 1;
            uVar3 = 0xff0000ff;
          }
          *(undefined4 *)((long)local_470.m_pixels.m_ptr + (long)(local_470.m_width * z + y) * 4) =
               uVar3;
          y = y + 1;
          iVar12 = local_458.m_size.m_data[1];
          iVar7 = local_458.m_size.m_data[0];
        } while (y < local_458.m_size.m_data[0]);
      }
      z = z + 1;
    } while (z < iVar12);
  }
  local_200._0_8_ =
       ((this->super_FramebufferRenderCase).super_RenderCase.super_TestCase.super_TestCase.
        super_TestNode.m_testCtx)->m_log;
  poVar15 = (ostringstream *)(local_200 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar15);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar15,"Found ",6);
  std::ostream::operator<<(poVar15,iVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar15," invalid pixel(s).",0x12);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_200,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar15);
  std::ios_base::~ios_base(local_188);
  this_02 = (this->super_FramebufferRenderCase).super_RenderCase.super_TestCase.super_TestCase.
            super_TestNode.m_testCtx;
  if (iVar2 == 0) {
    testResult = QP_TEST_RESULT_PASS;
    pcVar13 = "Pass";
  }
  else {
    this_00 = this_02->m_log;
    local_490._M_dataplus._M_p = (pointer)&local_490.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_490,"Results","");
    local_3a8._M_dataplus._M_p = (pointer)&local_3a8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3a8,"Result verification","");
    tcu::LogImageSet::LogImageSet(&local_360,&local_490,&local_3a8);
    tcu::TestLog::startImageSet
              (this_00,local_360.m_name._M_dataplus._M_p,local_360.m_description._M_dataplus._M_p);
    local_3c8._M_dataplus._M_p = (pointer)&local_3c8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_3c8,"Image with special green channel","");
    local_4b0._M_dataplus._M_p = (pointer)&local_4b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_4b0,"Image with special green channel","");
    tcu::ConstPixelBufferAccess::ConstPixelBufferAccess(&local_58,&local_458);
    pCVar11 = &local_58;
    tcu::LogImage::LogImage
              ((LogImage *)local_200,&local_3c8,&local_4b0,pCVar11,QP_IMAGE_COMPRESSION_MODE_BEST);
    iVar2 = (int)this_00;
    tcu::LogImage::write((LogImage *)local_200,iVar2,__buf,(size_t)pCVar11);
    local_4d0._M_dataplus._M_p = (pointer)&local_4d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_4d0,"Image with constant green channel","");
    local_3e8._M_dataplus._M_p = (pointer)&local_3e8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_3e8,"Image with constant green channel","");
    tcu::ConstPixelBufferAccess::ConstPixelBufferAccess(&local_80,&local_388);
    pCVar11 = &local_80;
    tcu::LogImage::LogImage
              ((LogImage *)local_320,&local_4d0,&local_3e8,pCVar11,QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write((LogImage *)local_320,iVar2,__buf_00,(size_t)pCVar11);
    local_408._M_dataplus._M_p = (pointer)&local_408.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_408,"Error Mask","");
    local_428._M_dataplus._M_p = (pointer)&local_428.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_428,"Error Mask","");
    surface = &local_470;
    tcu::LogImage::LogImage
              ((LogImage *)local_290,&local_408,&local_428,surface,QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write((LogImage *)local_290,iVar2,__buf_01,(size_t)surface);
    tcu::TestLog::endImageSet(this_00);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270._M_p != local_260) {
      operator_delete(local_270._M_p,local_260[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_290._4_4_,local_290._0_4_) != &local_280) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(local_290._4_4_,local_290._0_4_),
                      local_280._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_428._M_dataplus._M_p != &local_428.field_2) {
      operator_delete(local_428._M_dataplus._M_p,local_428.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_408._M_dataplus._M_p != &local_408.field_2) {
      operator_delete(local_408._M_dataplus._M_p,local_408.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_300._M_p != local_2f0) {
      operator_delete(local_300._M_p,local_2f0[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_320._4_4_,local_320._0_4_) != &local_310) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(local_320._4_4_,local_320._0_4_),
                      local_310._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
      operator_delete(local_3e8._M_dataplus._M_p,local_3e8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4d0._M_dataplus._M_p != &local_4d0.field_2) {
      operator_delete(local_4d0._M_dataplus._M_p,local_4d0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_p != local_1d0) {
      operator_delete(local_1e0._M_p,local_1d0[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200._0_8_ != &local_1f0) {
      operator_delete((void *)local_200._0_8_,local_1f0._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4b0._M_dataplus._M_p != &local_4b0.field_2) {
      operator_delete(local_4b0._M_dataplus._M_p,local_4b0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
      operator_delete(local_3c8._M_dataplus._M_p,local_3c8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_360.m_description._M_dataplus._M_p != &local_360.m_description.field_2) {
      operator_delete(local_360.m_description._M_dataplus._M_p,
                      local_360.m_description.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_360.m_name._M_dataplus._M_p != &local_360.m_name.field_2) {
      operator_delete(local_360.m_name._M_dataplus._M_p,
                      local_360.m_name.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
      operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_490._M_dataplus._M_p != &local_490.field_2) {
      operator_delete(local_490._M_dataplus._M_p,local_490.field_2._M_allocated_capacity + 1);
    }
    this_02 = (this->super_FramebufferRenderCase).super_RenderCase.super_TestCase.super_TestCase.
              super_TestNode.m_testCtx;
    pcVar13 = "Image comparison failed";
    testResult = QP_TEST_RESULT_FAIL;
  }
  tcu::TestContext::setTestResult(this_02,testResult,pcVar13);
  tcu::Surface::~Surface(&local_470);
  tcu::TextureLevel::~TextureLevel(&local_388);
  tcu::TextureLevel::~TextureLevel(&local_458);
  operator_delete(__s_00,0x108);
  operator_delete(__s,0x2e0);
  return;
}

Assistant:

void OutputCase::testFBO (void)
{
	// Create a 1 X [s_specialFloats] grid of tiles (stripes).
	std::vector<tcu::Vec4>	gridVertices	((DE_LENGTH_OF_ARRAY(s_specialFloats) + 1) * 2);
	std::vector<deUint16>	indices			(DE_LENGTH_OF_ARRAY(s_specialFloats) * 6);
	tcu::TextureFormat		textureFormat	(tcu::TextureFormat::RGBA, (m_fboType == FBO_RGBA_FLOAT16) ? (tcu::TextureFormat::FLOAT) : (tcu::TextureFormat::UNORM_INT8));
	tcu::TextureLevel		specialImage	(textureFormat, TEST_CANVAS_SIZE, TEST_CANVAS_SIZE);
	tcu::TextureLevel		normalImage		(textureFormat, TEST_CANVAS_SIZE, TEST_CANVAS_SIZE);

	// vertices
	for (int y = 0; y < DE_LENGTH_OF_ARRAY(s_specialFloats) + 1; ++y)
	{
		const float posY = (float)y / (float)DE_LENGTH_OF_ARRAY(s_specialFloats) * 2.0f - 1.0f; // map from [0, len(s_specialFloats) ] to [-1, 1]

		gridVertices[y * 2 + 0] = tcu::Vec4(-1.0, posY, 0.0f, 1.0f);
		gridVertices[y * 2 + 1] = tcu::Vec4( 1.0, posY, 0.0f, 1.0f);
	}

	// tiles
	for (int y = 0; y < DE_LENGTH_OF_ARRAY(s_specialFloats); ++y)
	{
		const int baseNdx = y * 6;

		indices[baseNdx + 0] = (deUint16)((y + 0) * 2);
		indices[baseNdx + 1] = (deUint16)((y + 1) * 2);
		indices[baseNdx + 2] = (deUint16)((y + 1) * 2 + 1);

		indices[baseNdx + 3] = (deUint16)((y + 0) * 2);
		indices[baseNdx + 4] = (deUint16)((y + 1) * 2 + 1);
		indices[baseNdx + 5] = (deUint16)((y + 0) * 2 + 1);
	}

	// Draw grids
	{
		const glw::Functions&	gl			= m_context.getRenderContext().getFunctions();
		const GLint				positionLoc	= gl.getAttribLocation(m_program->getProgram(), "a_pos");
		const GLint				specialLoc	= gl.getUniformLocation(m_program->getProgram(), "u_special");

		gl.clearColor(0.0f, 0.0f, 0.0f, 1.0f);
		gl.viewport(0, 0, TEST_CANVAS_SIZE, TEST_CANVAS_SIZE);
		gl.useProgram(m_program->getProgram());
		GLU_EXPECT_NO_ERROR(gl.getError(), "pre-draw");

		gl.vertexAttribPointer(positionLoc, 4, GL_FLOAT, GL_FALSE, 0, &gridVertices[0]);
		gl.enableVertexAttribArray(positionLoc);

		// draw 2 passes. Special and normal.
		for (int passNdx = 0; passNdx < 2; ++passNdx)
		{
			const bool specialPass	= (passNdx == 0);

			m_testCtx.getLog() << tcu::TestLog::Message << "Pass " << passNdx << ": Drawing stripes with the shader. Setting u_special for each stripe to (" << ((specialPass) ? ("special") : ("1.0")) << ")." << tcu::TestLog::EndMessage;

			// draw stripes
			gl.clear(GL_COLOR_BUFFER_BIT);
			for (int y = 0; y < DE_LENGTH_OF_ARRAY(s_specialFloats); ++y)
			{
				const deUint32	one				= 0x3F800000;
				const deUint32	special			= s_specialFloats[y];
				const deUint32	uniformValue	= (specialPass) ? (special) : (one);
				const int		indexIndex		= y * 6;

				gl.uniform1fv(specialLoc, 1, (const float*)&uniformValue);
				gl.drawElements(GL_TRIANGLES, 6, GL_UNSIGNED_SHORT, &indices[indexIndex]);
			}

			gl.finish();
			glu::readPixels(m_context.getRenderContext(), 0, 0, ((specialPass) ? (specialImage) : (normalImage)).getAccess());
		}

		gl.disableVertexAttribArray(positionLoc);
		gl.useProgram(0);
		GLU_EXPECT_NO_ERROR(gl.getError(), "OutputCase::iterate");
	}

	// Check results
	{
		tcu::Surface		errorMask		(TEST_CANVAS_SIZE, TEST_CANVAS_SIZE);
		const tcu::RGBA		badPixelColor	= tcu::RGBA::red();
		const tcu::RGBA		okPixelColor	= tcu::RGBA::green();
		int					badPixels		= 0;

		m_testCtx.getLog() << tcu::TestLog::Message << "Checking passes have identical red and blue channels and the green channel is correct in the constant pass." << tcu::TestLog::EndMessage;

		for (int y = 0; y < specialImage.getHeight(); ++y)
		for (int x = 0; x < specialImage.getWidth(); ++x)
		{
			const float		greenThreshold	= 0.1f;
			const tcu::Vec4	cNormal			= normalImage.getAccess().getPixel(x, y);
			const tcu::Vec4	cSpecial		= specialImage.getAccess().getPixel(x, y);

			if (cNormal.x() != cSpecial.x() || cNormal.z() != cSpecial.z() || cNormal.y() < 1.0f - greenThreshold)
			{
				++badPixels;
				errorMask.setPixel(x, y, badPixelColor);
			}
			else
				errorMask.setPixel(x, y, okPixelColor);
		}

		m_testCtx.getLog() << tcu::TestLog::Message << "Found " << badPixels << " invalid pixel(s)." << tcu::TestLog::EndMessage;

		if (badPixels)
		{
			m_testCtx.getLog()
					<< tcu::TestLog::ImageSet("Results", "Result verification")
					<< tcu::TestLog::Image("Image with special green channel",	"Image with special green channel",		specialImage)
					<< tcu::TestLog::Image("Image with constant green channel",	"Image with constant green channel",	normalImage)
					<< tcu::TestLog::Image("Error Mask",						"Error Mask",							errorMask)
					<< tcu::TestLog::EndImageSet;

			// all ok?
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image comparison failed");
		}
		else
			m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
}